

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_picker.cpp
# Opt level: O3

void QtMWidgets::Picker::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  int *piVar1;
  undefined4 *puVar2;
  code *pcVar3;
  long lVar4;
  QArrayData *pQVar5;
  char16_t *pcVar6;
  qsizetype qVar7;
  undefined8 uVar8;
  undefined8 uVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  Spec index;
  QColor *c;
  QColor QVar13;
  Private __tmp;
  QVariant moved;
  QString local_78;
  undefined8 uStack_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 uStack_40;
  anon_union_24_3_e3d07ef4_for_data local_38;
  undefined8 uStack_20;
  
  switch(_c) {
  case InvokeMetaMethod:
    switch(_id) {
    case 0:
      local_78.d.ptr = (char16_t *)&local_58;
      local_58._0_4_ = *_a[1];
      iVar12 = 0;
      break;
    case 1:
      local_78.d.ptr = (char16_t *)_a[1];
      iVar12 = 1;
      break;
    case 2:
      local_78.d.ptr = (char16_t *)&local_58;
      local_58._0_4_ = *_a[1];
      iVar12 = 2;
      break;
    case 3:
      local_78.d.ptr = (char16_t *)_a[1];
      iVar12 = 3;
      break;
    case 4:
      local_78.d.ptr = (char16_t *)_a[1];
      iVar12 = 4;
      break;
    case 5:
      clear((Picker *)_o);
      return;
    case 6:
      index = *_a[1];
LAB_00151451:
      setCurrentIndex((Picker *)_o,index);
      return;
    case 7:
      c = (QColor *)_a[1];
switchD_001510d0_caseD_2:
      setCurrentText((Picker *)_o,(QString *)c);
      return;
    case 8:
      scrollTo((Picker *)_o,*_a[1]);
      return;
    case 9:
      _q_emitCurrentIndexChanged((Picker *)_o,(QModelIndex *)_a[1]);
      return;
    case 10:
      _q_dataChanged((Picker *)_o,(QModelIndex *)_a[1],(QModelIndex *)_a[2]);
      return;
    case 0xb:
      _q_updateIndexBeforeChange((Picker *)_o);
      return;
    case 0xc:
      _q_rowsInserted((Picker *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
      return;
    case 0xd:
      _q_rowsRemoved((Picker *)_o,(QModelIndex *)_a[1],*_a[2],*_a[3]);
      return;
    case 0xe:
      _q_modelDestroyed((Picker *)_o);
      return;
    case 0xf:
      _q_modelReset((Picker *)_o);
      return;
    case 0x10:
      _q_scroll((Picker *)_o,*_a[1],*_a[2]);
      return;
    default:
      goto switchD_0015106b_caseD_3;
    }
    local_78.d.d = (Data *)0x0;
    QMetaObject::activate(_o,&staticMetaObject,iVar12,(void **)&local_78);
    break;
  case ReadProperty:
    if (6 < (uint)_id) {
      return;
    }
    piVar1 = (int *)*_a;
    switch(_id) {
    case 0:
      iVar12 = count((Picker *)_o);
      break;
    case 1:
      iVar12 = currentIndex((Picker *)_o);
      break;
    case 2:
      currentText(&local_78,(Picker *)_o);
      pQVar5 = *(QArrayData **)piVar1;
      *(Data **)piVar1 = local_78.d.d;
      pcVar6 = *(char16_t **)(piVar1 + 2);
      *(char16_t **)(piVar1 + 2) = local_78.d.ptr;
      qVar7 = *(qsizetype *)(piVar1 + 4);
      *(qsizetype *)(piVar1 + 4) = local_78.d.size;
      if (pQVar5 == (QArrayData *)0x0) {
        return;
      }
      LOCK();
      (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar5->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar5->ref_)._q_value.super___atomic_base<int>._M_i != 0) {
        return;
      }
      local_78.d.d = (Data *)pQVar5;
      local_78.d.ptr = pcVar6;
      local_78.d.size = qVar7;
      QArrayData::deallocate(pQVar5,2,8);
      return;
    case 3:
      currentData((QVariant *)&local_38,(Picker *)_o,0x100);
      uVar11 = uStack_20;
      uVar10 = local_38._16_8_;
      uVar9 = local_38._8_8_;
      uVar8 = local_38.shared;
      local_38.shared = (PrivateShared *)0x0;
      local_38._8_8_ = 0;
      local_38._16_8_ = 0;
      uStack_20 = 2;
      local_78.d.d = *(Data **)piVar1;
      local_78.d.ptr = *(char16_t **)(piVar1 + 2);
      local_78.d.size = *(qsizetype *)(piVar1 + 4);
      uStack_60 = *(undefined8 *)(piVar1 + 6);
      *(undefined8 *)(piVar1 + 4) = uVar10;
      *(undefined8 *)(piVar1 + 6) = uVar11;
      *(undefined8 *)piVar1 = uVar8;
      *(undefined8 *)(piVar1 + 2) = uVar9;
      local_58.shared = (PrivateShared *)local_78.d.d;
      local_58._8_8_ = local_78.d.ptr;
      local_58._16_8_ = local_78.d.size;
      uStack_40 = uStack_60;
      QVariant::~QVariant((QVariant *)&local_58);
      QVariant::~QVariant((QVariant *)&local_38);
      return;
    case 4:
      iVar12 = modelColumn((Picker *)_o);
      break;
    case 5:
      iVar12 = maxCount((Picker *)_o);
      break;
    case 6:
      QVar13 = highlightColor((Picker *)_o);
      *(long *)piVar1 = QVar13._0_8_;
      piVar1[2] = QVar13.ct._4_4_;
      *(short *)(piVar1 + 3) = QVar13.ct._8_2_;
      return;
    }
    *piVar1 = iVar12;
    break;
  case WriteProperty:
    if (_id - 1U < 6) {
      c = (QColor *)*_a;
      switch(_id) {
      case 1:
        index = c->cspec;
        goto LAB_00151451;
      case 2:
        goto switchD_001510d0_caseD_2;
      case 4:
        setModelColumn((Picker *)_o,c->cspec);
        return;
      case 5:
        setMaxCount((Picker *)_o,c->cspec);
        return;
      case 6:
        setHighlightColor((Picker *)_o,c);
        return;
      }
    }
    break;
  case IndexOfMethod:
    puVar2 = (undefined4 *)*_a;
    pcVar3 = *_a[1];
    lVar4 = *(long *)((long)_a[1] + 8);
    if (pcVar3 == activated && lVar4 == 0) {
      *puVar2 = 0;
    }
    else if (pcVar3 == activated && lVar4 == 0) {
      *puVar2 = 1;
    }
    else if (pcVar3 == currentIndexChanged && lVar4 == 0) {
      *puVar2 = 2;
    }
    else if (pcVar3 == currentIndexChanged && lVar4 == 0) {
      *puVar2 = 3;
    }
    else if (pcVar3 == currentTextChanged && lVar4 == 0) {
      *puVar2 = 4;
    }
  }
switchD_0015106b_caseD_3:
  return;
}

Assistant:

void QtMWidgets::Picker::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    if (_c == QMetaObject::InvokeMetaMethod) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        switch (_id) {
        case 0: _t->activated((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 1: _t->activated((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 2: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 3: _t->currentIndexChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 4: _t->currentTextChanged((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 5: _t->clear(); break;
        case 6: _t->setCurrentIndex((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 7: _t->setCurrentText((*reinterpret_cast< std::add_pointer_t<QString>>(_a[1]))); break;
        case 8: _t->scrollTo((*reinterpret_cast< std::add_pointer_t<int>>(_a[1]))); break;
        case 9: _t->_q_emitCurrentIndexChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 10: _t->_q_dataChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[2]))); break;
        case 11: _t->_q_updateIndexBeforeChange(); break;
        case 12: _t->_q_rowsInserted((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 13: _t->_q_rowsRemoved((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[3]))); break;
        case 14: _t->_q_modelDestroyed(); break;
        case 15: _t->_q_modelReset(); break;
        case 16: _t->_q_scroll((*reinterpret_cast< std::add_pointer_t<int>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<int>>(_a[2]))); break;
        default: ;
        }
    } else if (_c == QMetaObject::IndexOfMethod) {
        int *result = reinterpret_cast<int *>(_a[0]);
        {
            using _t = void (Picker::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::activated)) {
                *result = 0;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::activated)) {
                *result = 1;
                return;
            }
        }
        {
            using _t = void (Picker::*)(int );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentIndexChanged)) {
                *result = 2;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentIndexChanged)) {
                *result = 3;
                return;
            }
        }
        {
            using _t = void (Picker::*)(const QString & );
            if (*reinterpret_cast<_t *>(_a[1]) == static_cast<_t>(&Picker::currentTextChanged)) {
                *result = 4;
                return;
            }
        }
    }
#ifndef QT_NO_PROPERTIES
    else if (_c == QMetaObject::ReadProperty) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast< int*>(_v) = _t->count(); break;
        case 1: *reinterpret_cast< int*>(_v) = _t->currentIndex(); break;
        case 2: *reinterpret_cast< QString*>(_v) = _t->currentText(); break;
        case 3: *reinterpret_cast< QVariant*>(_v) = _t->currentData(); break;
        case 4: *reinterpret_cast< int*>(_v) = _t->modelColumn(); break;
        case 5: *reinterpret_cast< int*>(_v) = _t->maxCount(); break;
        case 6: *reinterpret_cast< QColor*>(_v) = _t->highlightColor(); break;
        default: break;
        }
    } else if (_c == QMetaObject::WriteProperty) {
        auto *_t = static_cast<Picker *>(_o);
        (void)_t;
        void *_v = _a[0];
        switch (_id) {
        case 1: _t->setCurrentIndex(*reinterpret_cast< int*>(_v)); break;
        case 2: _t->setCurrentText(*reinterpret_cast< QString*>(_v)); break;
        case 4: _t->setModelColumn(*reinterpret_cast< int*>(_v)); break;
        case 5: _t->setMaxCount(*reinterpret_cast< int*>(_v)); break;
        case 6: _t->setHighlightColor(*reinterpret_cast< QColor*>(_v)); break;
        default: break;
        }
    } else if (_c == QMetaObject::ResetProperty) {
    } else if (_c == QMetaObject::BindableProperty) {
    }
#endif // QT_NO_PROPERTIES
}